

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  short *psVar1;
  ushort *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  int iVar10;
  int iVar11;
  parasail_result_t *ppVar12;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar13;
  int iVar14;
  uint uVar15;
  int16_t iVar16;
  __m128i *palVar17;
  int32_t segNum;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  undefined2 uVar31;
  long lVar32;
  short sVar33;
  undefined4 uVar34;
  short sVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  ushort uVar42;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar50;
  short sVar58;
  short sVar59;
  short sVar60;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar62 [16];
  ushort uVar63;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  undefined1 auVar64 [16];
  ushort uVar71;
  __m128i_16_t e;
  __m128i_16_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  undefined1 auVar54 [16];
  short sVar61;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_table_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar15 = profile->s1Len;
        if ((int)uVar15 < 1) {
          parasail_nw_table_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_sse41_128_16_cold_4();
        }
        else {
          uVar28 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_scan_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_scan_profile_sse41_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_scan_profile_sse41_128_16_cold_1();
          }
          else {
            iVar11 = uVar15 - 1;
            uVar30 = (ulong)uVar15 + 7 >> 3;
            iVar29 = (int)uVar30;
            iVar27 = -open;
            iVar18 = ppVar4->min;
            iVar21 = -iVar18;
            if (iVar18 != iVar27 && SBORROW4(iVar18,iVar27) == iVar18 + open < 0) {
              iVar21 = open;
            }
            iVar10 = ppVar4->max;
            ppVar12 = parasail_result_new_table1((uint)((ulong)uVar15 + 7) & 0x7ffffff8,s2Len);
            if (ppVar12 != (parasail_result_t *)0x0) {
              ppVar12->flag = ppVar12->flag | 0x8220401;
              ptr = parasail_memalign___m128i(0x10,uVar30);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,uVar30);
              ptr_02 = parasail_memalign___m128i(0x10,uVar30);
              ptr_03 = parasail_memalign___m128i(0x10,uVar30);
              if (ptr_03 != (__m128i *)0x0 &&
                  ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                  (ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0))) {
                iVar13 = s2Len + -1;
                iVar14 = 7 - iVar11 / iVar29;
                auVar35 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar34 = auVar35._0_4_;
                auVar39._4_4_ = uVar34;
                auVar39._0_4_ = uVar34;
                auVar39._8_4_ = uVar34;
                auVar39._12_4_ = uVar34;
                auVar35 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar34 = auVar35._0_4_;
                uVar15 = iVar21 - 0x7fff;
                auVar35 = pshuflw(ZEXT416(uVar15),ZEXT416(uVar15),0);
                auVar36._0_4_ = auVar35._0_4_;
                auVar36._4_4_ = auVar36._0_4_;
                auVar36._8_4_ = auVar36._0_4_;
                auVar36._12_4_ = auVar36._0_4_;
                auVar38 = ZEXT416(CONCAT22((short)((uint)iVar18 >> 0x10),0x7ffe - (short)iVar10));
                auVar38 = pshuflw(auVar38,auVar38,0);
                auVar46._0_4_ = auVar38._0_4_;
                auVar46._4_4_ = auVar46._0_4_;
                auVar46._8_4_ = auVar46._0_4_;
                auVar46._12_4_ = auVar46._0_4_;
                auVar40 = pshufb(ZEXT416((uint)-(iVar29 * gap)),_DAT_008d2ad0);
                auVar40 = paddsw(auVar40,ZEXT416(uVar15 & 0xffff));
                lVar23 = (long)iVar27;
                uVar24 = 0;
                do {
                  lVar19 = 0;
                  lVar26 = lVar23;
                  do {
                    uVar31 = 0x8000;
                    if (-0x8000 < lVar26) {
                      uVar31 = (undefined2)lVar26;
                    }
                    *(undefined2 *)((long)&local_48 + lVar19 * 2) = uVar31;
                    lVar32 = lVar26 - (ulong)(uint)open;
                    if (lVar32 < -0x7fff) {
                      lVar32 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar19 * 2) = (short)lVar32;
                    lVar19 = lVar19 + 1;
                    lVar26 = lVar26 - uVar30 * (uint)gap;
                  } while (lVar19 != 8);
                  ptr_02[uVar24][0] = local_48;
                  ptr_02[uVar24][1] = lStack_40;
                  ptr[uVar24][0] = local_58;
                  ptr[uVar24][1] = lStack_50;
                  uVar24 = uVar24 + 1;
                  lVar23 = lVar23 - (ulong)(uint)gap;
                } while (uVar24 != uVar30);
                *ptr_00 = 0;
                uVar24 = 1;
                do {
                  iVar16 = -0x8000;
                  if (-0x8000 < iVar27) {
                    iVar16 = (int16_t)iVar27;
                  }
                  ptr_00[uVar24] = iVar16;
                  uVar24 = uVar24 + 1;
                  iVar27 = iVar27 - gap;
                } while (s2Len + 1 != uVar24);
                alVar41 = (__m128i)psubsw((undefined1  [16])0x0,auVar39);
                palVar17 = ptr_03 + (iVar29 - 1U);
                uVar24 = uVar30;
                do {
                  *palVar17 = alVar41;
                  auVar64._4_4_ = uVar34;
                  auVar64._0_4_ = uVar34;
                  auVar64._8_4_ = uVar34;
                  auVar64._12_4_ = uVar34;
                  alVar41 = (__m128i)psubsw((undefined1  [16])alVar41,auVar64);
                  palVar17 = palVar17 + -1;
                  iVar18 = (int)uVar24;
                  uVar22 = iVar18 - 1;
                  uVar24 = (ulong)uVar22;
                } while (uVar22 != 0 && 0 < iVar18);
                uVar24 = 1;
                if (1 < s2Len) {
                  uVar24 = uVar28;
                }
                lVar19 = (ulong)(iVar29 + (uint)(iVar29 == 0)) << 4;
                lVar26 = uVar30 * uVar28;
                lVar23 = 0;
                uVar25 = 0;
                auVar57 = auVar36;
                do {
                  uVar9 = ptr_02[iVar29 - 1U][0];
                  auVar44._8_8_ = ptr_02[iVar29 - 1U][1] << 0x10 | uVar9 >> 0x30;
                  auVar44._0_8_ = uVar9 << 0x10 | (ulong)(ushort)ptr_00[uVar25];
                  iVar18 = ppVar4->mapper[(byte)s2[uVar25]];
                  auVar43 = psubsw(auVar36,(undefined1  [16])*ptr_03);
                  lVar32 = 0;
                  auVar64 = auVar36;
                  do {
                    auVar52 = *(undefined1 (*) [16])((long)*ptr_02 + lVar32);
                    auVar62 = paddsw(auVar44,*(undefined1 (*) [16])
                                              ((long)pvVar3 + lVar32 + (long)iVar18 * uVar30 * 0x10)
                                    );
                    auVar44 = paddsw(auVar43,*(undefined1 (*) [16])((long)*ptr_03 + lVar32));
                    auVar7._4_4_ = uVar34;
                    auVar7._0_4_ = uVar34;
                    auVar7._8_4_ = uVar34;
                    auVar7._12_4_ = uVar34;
                    auVar43 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar32),auVar7);
                    sVar33 = auVar44._0_2_;
                    sVar37 = auVar64._0_2_;
                    auVar51._0_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar44._2_2_;
                    sVar37 = auVar64._2_2_;
                    auVar51._2_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar44._4_2_;
                    sVar37 = auVar64._4_2_;
                    auVar51._4_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar44._6_2_;
                    sVar37 = auVar64._6_2_;
                    auVar51._6_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar44._8_2_;
                    sVar37 = auVar64._8_2_;
                    auVar51._8_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar44._10_2_;
                    sVar37 = auVar64._10_2_;
                    auVar51._10_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar44._12_2_;
                    sVar37 = auVar64._12_2_;
                    sVar61 = auVar64._14_2_;
                    auVar51._12_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar44._14_2_;
                    auVar51._14_2_ =
                         (ushort)(sVar61 < sVar33) * sVar33 | (ushort)(sVar61 >= sVar33) * sVar61;
                    auVar64 = psubsw(auVar52,auVar39);
                    sVar33 = auVar43._0_2_;
                    sVar37 = auVar64._0_2_;
                    uVar63 = (ushort)(sVar37 < sVar33) * sVar33 |
                             (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar43._2_2_;
                    sVar37 = auVar64._2_2_;
                    uVar65 = (ushort)(sVar37 < sVar33) * sVar33 |
                             (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar43._4_2_;
                    sVar37 = auVar64._4_2_;
                    uVar66 = (ushort)(sVar37 < sVar33) * sVar33 |
                             (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar43._6_2_;
                    sVar37 = auVar64._6_2_;
                    uVar67 = (ushort)(sVar37 < sVar33) * sVar33 |
                             (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar43._8_2_;
                    sVar37 = auVar64._8_2_;
                    uVar68 = (ushort)(sVar37 < sVar33) * sVar33 |
                             (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar43._10_2_;
                    sVar37 = auVar64._10_2_;
                    uVar69 = (ushort)(sVar37 < sVar33) * sVar33 |
                             (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar43._12_2_;
                    sVar37 = auVar64._12_2_;
                    sVar61 = auVar64._14_2_;
                    uVar70 = (ushort)(sVar37 < sVar33) * sVar33 |
                             (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar43._14_2_;
                    uVar71 = (ushort)(sVar61 < sVar33) * sVar33 |
                             (ushort)(sVar61 >= sVar33) * sVar61;
                    sVar33 = auVar62._0_2_;
                    uVar42 = (sVar33 < (short)uVar63) * uVar63 |
                             (ushort)(sVar33 >= (short)uVar63) * sVar33;
                    sVar33 = auVar62._2_2_;
                    uVar47 = (sVar33 < (short)uVar65) * uVar65 |
                             (ushort)(sVar33 >= (short)uVar65) * sVar33;
                    sVar33 = auVar62._4_2_;
                    uVar48 = (sVar33 < (short)uVar66) * uVar66 |
                             (ushort)(sVar33 >= (short)uVar66) * sVar33;
                    sVar33 = auVar62._6_2_;
                    uVar49 = (sVar33 < (short)uVar67) * uVar67 |
                             (ushort)(sVar33 >= (short)uVar67) * sVar33;
                    auVar43._0_8_ = CONCAT26(uVar49,CONCAT24(uVar48,CONCAT22(uVar47,uVar42)));
                    sVar33 = auVar62._8_2_;
                    auVar43._8_2_ =
                         (sVar33 < (short)uVar68) * uVar68 |
                         (ushort)(sVar33 >= (short)uVar68) * sVar33;
                    sVar33 = auVar62._10_2_;
                    auVar43._10_2_ =
                         (sVar33 < (short)uVar69) * uVar69 |
                         (ushort)(sVar33 >= (short)uVar69) * sVar33;
                    sVar33 = auVar62._12_2_;
                    sVar37 = auVar62._14_2_;
                    auVar43._12_2_ =
                         (sVar33 < (short)uVar70) * uVar70 |
                         (ushort)(sVar33 >= (short)uVar70) * sVar33;
                    auVar43._14_2_ =
                         (sVar37 < (short)uVar71) * uVar71 |
                         (ushort)(sVar37 >= (short)uVar71) * sVar37;
                    puVar2 = (ushort *)((long)*ptr + lVar32);
                    *puVar2 = uVar63;
                    puVar2[1] = uVar65;
                    puVar2[2] = uVar66;
                    puVar2[3] = uVar67;
                    puVar2[4] = uVar68;
                    puVar2[5] = uVar69;
                    puVar2[6] = uVar70;
                    puVar2[7] = uVar71;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar32) = auVar43;
                    lVar32 = lVar32 + 0x10;
                    auVar64 = auVar51;
                    auVar44 = auVar52;
                  } while (lVar19 != lVar32);
                  auVar62._8_8_ = auVar43._8_8_ << 0x10 | (ulong)uVar49;
                  uVar63 = ptr_00[uVar25 + 1];
                  auVar62._0_8_ = auVar43._0_8_ << 0x10 | (ulong)uVar63;
                  uVar25 = uVar25 + 1;
                  auVar64 = paddsw((undefined1  [16])*ptr_03,auVar62);
                  sVar33 = auVar64._0_2_;
                  auVar52._0_2_ =
                       (ushort)((short)auVar51._0_2_ < sVar33) * sVar33 |
                       ((short)auVar51._0_2_ >= sVar33) * auVar51._0_2_;
                  sVar33 = auVar64._2_2_;
                  auVar52._2_2_ =
                       (ushort)((short)auVar51._2_2_ < sVar33) * sVar33 |
                       ((short)auVar51._2_2_ >= sVar33) * auVar51._2_2_;
                  sVar33 = auVar64._4_2_;
                  auVar52._4_2_ =
                       (ushort)((short)auVar51._4_2_ < sVar33) * sVar33 |
                       ((short)auVar51._4_2_ >= sVar33) * auVar51._4_2_;
                  sVar33 = auVar64._6_2_;
                  auVar52._6_2_ =
                       (ushort)((short)auVar51._6_2_ < sVar33) * sVar33 |
                       ((short)auVar51._6_2_ >= sVar33) * auVar51._6_2_;
                  sVar33 = auVar64._8_2_;
                  auVar52._8_2_ =
                       (ushort)((short)auVar51._8_2_ < sVar33) * sVar33 |
                       ((short)auVar51._8_2_ >= sVar33) * auVar51._8_2_;
                  sVar33 = auVar64._10_2_;
                  auVar52._10_2_ =
                       (ushort)((short)auVar51._10_2_ < sVar33) * sVar33 |
                       ((short)auVar51._10_2_ >= sVar33) * auVar51._10_2_;
                  sVar33 = auVar64._12_2_;
                  auVar52._12_2_ =
                       (ushort)((short)auVar51._12_2_ < sVar33) * sVar33 |
                       ((short)auVar51._12_2_ >= sVar33) * auVar51._12_2_;
                  sVar33 = auVar64._14_2_;
                  auVar52._14_2_ =
                       (ushort)((short)auVar51._14_2_ < sVar33) * sVar33 |
                       ((short)auVar51._14_2_ >= sVar33) * auVar51._14_2_;
                  iVar18 = 6;
                  do {
                    auVar53._0_8_ = auVar52._0_8_ << 0x10;
                    auVar53._8_8_ = auVar52._8_8_ << 0x10 | auVar52._0_8_ >> 0x30;
                    auVar64 = paddsw(auVar53,auVar40);
                    sVar33 = auVar52._0_2_;
                    sVar50 = auVar64._0_2_;
                    sVar37 = auVar52._2_2_;
                    sVar58 = auVar64._2_2_;
                    sVar61 = auVar52._4_2_;
                    sVar59 = auVar64._4_2_;
                    sVar6 = auVar52._6_2_;
                    sVar60 = auVar64._6_2_;
                    uVar65 = (ushort)(sVar60 < sVar6) * sVar6 | (ushort)(sVar60 >= sVar6) * sVar60;
                    auVar54._0_8_ =
                         CONCAT26(uVar65,CONCAT24((ushort)(sVar59 < sVar61) * sVar61 |
                                                  (ushort)(sVar59 >= sVar61) * sVar59,
                                                  CONCAT22((ushort)(sVar58 < sVar37) * sVar37 |
                                                           (ushort)(sVar58 >= sVar37) * sVar58,
                                                           (ushort)(sVar50 < sVar33) * sVar33 |
                                                           (ushort)(sVar50 >= sVar33) * sVar50)));
                    sVar33 = auVar52._8_2_;
                    sVar37 = auVar64._8_2_;
                    auVar54._8_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar52._10_2_;
                    sVar37 = auVar64._10_2_;
                    auVar54._10_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar52._12_2_;
                    sVar37 = auVar64._12_2_;
                    sVar61 = auVar64._14_2_;
                    auVar54._12_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar52._14_2_;
                    auVar54._14_2_ =
                         (ushort)(sVar61 < sVar33) * sVar33 | (ushort)(sVar61 >= sVar33) * sVar61;
                    iVar18 = iVar18 + -1;
                    auVar52 = auVar54;
                  } while (iVar18 != 0);
                  auVar55._0_8_ = auVar54._0_8_ << 0x10;
                  auVar55._8_8_ = auVar54._8_8_ << 0x10 | (ulong)uVar65;
                  auVar56 = paddsw(auVar55,ZEXT416(uVar15 & 0xffff));
                  sVar33 = auVar56._0_2_;
                  auVar45._0_2_ =
                       (ushort)((short)uVar63 < sVar33) * sVar33 |
                       ((short)uVar63 >= sVar33) * uVar63;
                  sVar33 = auVar56._2_2_;
                  auVar45._2_2_ =
                       (ushort)((short)uVar42 < sVar33) * sVar33 |
                       ((short)uVar42 >= sVar33) * uVar42;
                  sVar33 = auVar56._4_2_;
                  auVar45._4_2_ =
                       (ushort)((short)uVar47 < sVar33) * sVar33 |
                       ((short)uVar47 >= sVar33) * uVar47;
                  sVar33 = auVar56._6_2_;
                  auVar45._6_2_ =
                       (ushort)((short)uVar48 < sVar33) * sVar33 |
                       ((short)uVar48 >= sVar33) * uVar48;
                  sVar33 = auVar56._8_2_;
                  auVar45._8_2_ =
                       (ushort)((short)uVar49 < sVar33) * sVar33 |
                       ((short)uVar49 >= sVar33) * uVar49;
                  sVar33 = auVar56._10_2_;
                  auVar45._10_2_ =
                       (ushort)((short)auVar43._8_2_ < sVar33) * sVar33 |
                       ((short)auVar43._8_2_ >= sVar33) * auVar43._8_2_;
                  sVar33 = auVar56._12_2_;
                  auVar45._12_2_ =
                       (ushort)((short)auVar43._10_2_ < sVar33) * sVar33 |
                       ((short)auVar43._10_2_ >= sVar33) * auVar43._10_2_;
                  sVar33 = auVar56._14_2_;
                  auVar45._14_2_ =
                       (ushort)((short)auVar43._12_2_ < sVar33) * sVar33 |
                       ((short)auVar43._12_2_ >= sVar33) * auVar43._12_2_;
                  lVar20 = 0;
                  lVar32 = lVar23;
                  auVar64 = auVar57;
                  auVar44 = auVar46;
                  do {
                    auVar8._4_4_ = uVar34;
                    auVar8._0_4_ = uVar34;
                    auVar8._8_4_ = uVar34;
                    auVar8._12_4_ = uVar34;
                    auVar57 = psubsw(auVar56,auVar8);
                    auVar46 = psubsw(auVar45,auVar39);
                    sVar33 = auVar46._0_2_;
                    sVar37 = auVar57._0_2_;
                    auVar56._0_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar46._2_2_;
                    sVar37 = auVar57._2_2_;
                    auVar56._2_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar46._4_2_;
                    sVar37 = auVar57._4_2_;
                    auVar56._4_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar46._6_2_;
                    sVar37 = auVar57._6_2_;
                    auVar56._6_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar46._8_2_;
                    sVar37 = auVar57._8_2_;
                    auVar56._8_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar46._10_2_;
                    sVar37 = auVar57._10_2_;
                    auVar56._10_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar46._12_2_;
                    sVar37 = auVar57._12_2_;
                    sVar61 = auVar57._14_2_;
                    auVar56._12_2_ =
                         (ushort)(sVar37 < sVar33) * sVar33 | (ushort)(sVar37 >= sVar33) * sVar37;
                    sVar33 = auVar46._14_2_;
                    auVar56._14_2_ =
                         (ushort)(sVar61 < sVar33) * sVar33 | (ushort)(sVar61 >= sVar33) * sVar61;
                    psVar1 = (short *)((long)*ptr_01 + lVar20);
                    sVar33 = *psVar1;
                    sVar37 = psVar1[1];
                    sVar61 = psVar1[2];
                    sVar6 = psVar1[3];
                    sVar50 = psVar1[4];
                    sVar58 = psVar1[5];
                    sVar59 = psVar1[6];
                    sVar60 = psVar1[7];
                    auVar45._0_2_ =
                         (sVar33 < (short)auVar56._0_2_) * auVar56._0_2_ |
                         (ushort)(sVar33 >= (short)auVar56._0_2_) * sVar33;
                    auVar45._2_2_ =
                         (sVar37 < (short)auVar56._2_2_) * auVar56._2_2_ |
                         (ushort)(sVar37 >= (short)auVar56._2_2_) * sVar37;
                    auVar45._4_2_ =
                         (sVar61 < (short)auVar56._4_2_) * auVar56._4_2_ |
                         (ushort)(sVar61 >= (short)auVar56._4_2_) * sVar61;
                    auVar45._6_2_ =
                         (sVar6 < (short)auVar56._6_2_) * auVar56._6_2_ |
                         (ushort)(sVar6 >= (short)auVar56._6_2_) * sVar6;
                    auVar45._8_2_ =
                         (sVar50 < (short)auVar56._8_2_) * auVar56._8_2_ |
                         (ushort)(sVar50 >= (short)auVar56._8_2_) * sVar50;
                    auVar45._10_2_ =
                         (sVar58 < (short)auVar56._10_2_) * auVar56._10_2_ |
                         (ushort)(sVar58 >= (short)auVar56._10_2_) * sVar58;
                    auVar45._12_2_ =
                         (sVar59 < (short)auVar56._12_2_) * auVar56._12_2_ |
                         (ushort)(sVar59 >= (short)auVar56._12_2_) * sVar59;
                    auVar45._14_2_ =
                         (sVar60 < (short)auVar56._14_2_) * auVar56._14_2_ |
                         (ushort)(sVar60 >= (short)auVar56._14_2_) * sVar60;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar20) = auVar45;
                    piVar5 = ((ppVar12->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar32) = (int)(short)auVar45._0_2_;
                    *(int *)((long)piVar5 + lVar26 * 4 + lVar32) = (int)(short)auVar45._2_2_;
                    *(int *)((long)piVar5 + lVar26 * 8 + lVar32) = (int)(short)auVar45._4_2_;
                    *(int *)((long)piVar5 + lVar26 * 0xc + lVar32) = (int)(short)auVar45._6_2_;
                    *(int *)((long)piVar5 + lVar26 * 0x10 + lVar32) = (int)(short)auVar45._8_2_;
                    *(int *)((long)piVar5 + lVar26 * 0x14 + lVar32) = (int)(short)auVar45._10_2_;
                    *(int *)((long)piVar5 + lVar26 * 0x18 + lVar32) = (int)(short)auVar45._12_2_;
                    *(int *)((long)piVar5 + lVar26 * 0x1c + lVar32) = (int)(short)auVar45._14_2_;
                    sVar33 = auVar44._0_2_;
                    auVar46._0_2_ =
                         ((short)auVar45._0_2_ < sVar33) * auVar45._0_2_ |
                         (ushort)((short)auVar45._0_2_ >= sVar33) * sVar33;
                    sVar33 = auVar44._2_2_;
                    auVar46._2_2_ =
                         ((short)auVar45._2_2_ < sVar33) * auVar45._2_2_ |
                         (ushort)((short)auVar45._2_2_ >= sVar33) * sVar33;
                    sVar33 = auVar44._4_2_;
                    auVar46._4_2_ =
                         ((short)auVar45._4_2_ < sVar33) * auVar45._4_2_ |
                         (ushort)((short)auVar45._4_2_ >= sVar33) * sVar33;
                    sVar33 = auVar44._6_2_;
                    auVar46._6_2_ =
                         ((short)auVar45._6_2_ < sVar33) * auVar45._6_2_ |
                         (ushort)((short)auVar45._6_2_ >= sVar33) * sVar33;
                    sVar33 = auVar44._8_2_;
                    auVar46._8_2_ =
                         ((short)auVar45._8_2_ < sVar33) * auVar45._8_2_ |
                         (ushort)((short)auVar45._8_2_ >= sVar33) * sVar33;
                    sVar33 = auVar44._10_2_;
                    auVar46._10_2_ =
                         ((short)auVar45._10_2_ < sVar33) * auVar45._10_2_ |
                         (ushort)((short)auVar45._10_2_ >= sVar33) * sVar33;
                    sVar33 = auVar44._12_2_;
                    sVar37 = auVar44._14_2_;
                    auVar46._12_2_ =
                         ((short)auVar45._12_2_ < sVar33) * auVar45._12_2_ |
                         (ushort)((short)auVar45._12_2_ >= sVar33) * sVar33;
                    auVar46._14_2_ =
                         ((short)auVar45._14_2_ < sVar37) * auVar45._14_2_ |
                         (ushort)((short)auVar45._14_2_ >= sVar37) * sVar37;
                    sVar33 = auVar64._0_2_;
                    auVar57._0_2_ =
                         (sVar33 < (short)auVar45._0_2_) * auVar45._0_2_ |
                         (ushort)(sVar33 >= (short)auVar45._0_2_) * sVar33;
                    sVar33 = auVar64._2_2_;
                    auVar57._2_2_ =
                         (sVar33 < (short)auVar45._2_2_) * auVar45._2_2_ |
                         (ushort)(sVar33 >= (short)auVar45._2_2_) * sVar33;
                    sVar33 = auVar64._4_2_;
                    auVar57._4_2_ =
                         (sVar33 < (short)auVar45._4_2_) * auVar45._4_2_ |
                         (ushort)(sVar33 >= (short)auVar45._4_2_) * sVar33;
                    sVar33 = auVar64._6_2_;
                    auVar57._6_2_ =
                         (sVar33 < (short)auVar45._6_2_) * auVar45._6_2_ |
                         (ushort)(sVar33 >= (short)auVar45._6_2_) * sVar33;
                    sVar33 = auVar64._8_2_;
                    auVar57._8_2_ =
                         (sVar33 < (short)auVar45._8_2_) * auVar45._8_2_ |
                         (ushort)(sVar33 >= (short)auVar45._8_2_) * sVar33;
                    sVar33 = auVar64._10_2_;
                    auVar57._10_2_ =
                         (sVar33 < (short)auVar45._10_2_) * auVar45._10_2_ |
                         (ushort)(sVar33 >= (short)auVar45._10_2_) * sVar33;
                    sVar33 = auVar64._12_2_;
                    sVar37 = auVar64._14_2_;
                    auVar57._12_2_ =
                         (sVar33 < (short)auVar45._12_2_) * auVar45._12_2_ |
                         (ushort)(sVar33 >= (short)auVar45._12_2_) * sVar33;
                    auVar57._14_2_ =
                         (sVar37 < (short)auVar45._14_2_) * auVar45._14_2_ |
                         (ushort)(sVar37 >= (short)auVar45._14_2_) * sVar37;
                    lVar20 = lVar20 + 0x10;
                    lVar32 = lVar32 + uVar28 * 4;
                    auVar64 = auVar57;
                    auVar44 = auVar46;
                  } while (lVar19 != lVar20);
                  lVar23 = lVar23 + 4;
                } while (uVar25 != uVar24);
                uVar28 = ptr_02[(uint)(iVar11 % iVar29)][0];
                uVar30 = ptr_02[(uint)(iVar11 % iVar29)][1];
                if (iVar11 / iVar29 < 7) {
                  iVar18 = 1;
                  if (1 < iVar14) {
                    iVar18 = iVar14;
                  }
                  do {
                    uVar30 = uVar30 << 0x10 | uVar28 >> 0x30;
                    iVar18 = iVar18 + -1;
                    uVar28 = uVar28 << 0x10;
                  } while (iVar18 != 0);
                }
                sVar33 = auVar35._0_2_;
                auVar40._0_2_ = -(ushort)((short)auVar46._0_2_ < sVar33);
                sVar37 = auVar35._2_2_;
                auVar40._2_2_ = -(ushort)((short)auVar46._2_2_ < sVar37);
                auVar40._4_2_ = -(ushort)((short)auVar46._4_2_ < sVar33);
                auVar40._6_2_ = -(ushort)((short)auVar46._6_2_ < sVar37);
                auVar40._8_2_ = -(ushort)((short)auVar46._8_2_ < sVar33);
                auVar40._10_2_ = -(ushort)((short)auVar46._10_2_ < sVar37);
                auVar40._12_2_ = -(ushort)((short)auVar46._12_2_ < sVar33);
                auVar40._14_2_ = -(ushort)((short)auVar46._14_2_ < sVar37);
                sVar33 = auVar38._0_2_;
                auVar35._0_2_ = -(ushort)(sVar33 < (short)auVar57._0_2_);
                sVar37 = auVar38._2_2_;
                auVar35._2_2_ = -(ushort)(sVar37 < (short)auVar57._2_2_);
                auVar35._4_2_ = -(ushort)(sVar33 < (short)auVar57._4_2_);
                auVar35._6_2_ = -(ushort)(sVar37 < (short)auVar57._6_2_);
                auVar35._8_2_ = -(ushort)(sVar33 < (short)auVar57._8_2_);
                auVar35._10_2_ = -(ushort)(sVar37 < (short)auVar57._10_2_);
                auVar35._12_2_ = -(ushort)(sVar33 < (short)auVar57._12_2_);
                auVar35._14_2_ = -(ushort)(sVar37 < (short)auVar57._14_2_);
                auVar35 = auVar35 | auVar40;
                if ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                 (auVar35 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && (auVar35 >> 0x17 & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                               (auVar35 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar35 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar35 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar35 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar35 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar35 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar35 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar35 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar35 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar35 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar35[0xf]) {
                  sVar33 = (short)(uVar30 >> 0x30);
                }
                else {
                  *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                  sVar33 = 0;
                  iVar13 = 0;
                  iVar11 = 0;
                }
                ppVar12->score = (int)sVar33;
                ppVar12->end_query = iVar11;
                ppVar12->end_ref = iVar13;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar12;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}